

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O3

int mbedtls_pkcs5_pbes2(mbedtls_asn1_buf *pbe_params,int mode,uchar *pwd,size_t pwdlen,uchar *data,
                       size_t datalen,uchar *output)

{
  int iVar1;
  int iVar2;
  mbedtls_cipher_info_t *cipher_info;
  uchar *end;
  int keylen;
  mbedtls_md_info_t *local_190;
  int iterations;
  mbedtls_cipher_type_t cipher_alg;
  uchar *p;
  uchar key [32];
  size_t olen;
  mbedtls_asn1_buf enc_scheme_params;
  mbedtls_asn1_buf salt;
  mbedtls_asn1_buf kdf_alg_params;
  mbedtls_md_context_t md_ctx;
  mbedtls_asn1_buf kdf_alg_oid;
  mbedtls_cipher_context_t cipher_ctx;
  mbedtls_asn1_buf enc_scheme_oid;
  uchar iv [32];
  
  iterations = 0;
  keylen = 0;
  olen = 0;
  p = pbe_params->p;
  if (pbe_params->tag != 0x30) {
    return -0x2f62;
  }
  end = p + pbe_params->len;
  iVar1 = mbedtls_asn1_get_alg(&p,end,&kdf_alg_oid,&kdf_alg_params);
  if (iVar1 == 0) {
    if ((kdf_alg_oid.len == 9) &&
       (kdf_alg_oid.p[8] == '\f' && *(long *)kdf_alg_oid.p == 0x5010df78648862a)) {
      key._0_8_ = kdf_alg_params.p;
      if (kdf_alg_params.tag != 0x30) {
        return -0x2f62;
      }
      local_190 = (mbedtls_md_info_t *)(kdf_alg_params.p + kdf_alg_params.len);
      iVar1 = mbedtls_asn1_get_tag((uchar **)key,(uchar *)local_190,&salt.len,4);
      if (iVar1 == 0) {
        salt.p = (uchar *)key._0_8_;
        key._0_8_ = key._0_8_ + salt.len;
        iVar1 = mbedtls_asn1_get_int((uchar **)key,(uchar *)local_190,&iterations);
        if (iVar1 != 0) goto LAB_00170505;
        if ((mbedtls_md_info_t *)key._0_8_ != local_190) {
          iVar1 = mbedtls_asn1_get_int((uchar **)key,(uchar *)local_190,&keylen);
          if ((iVar1 != 0) && (iVar1 != -0x62)) goto LAB_00170505;
          if ((mbedtls_md_info_t *)key._0_8_ != local_190) {
            iVar1 = mbedtls_asn1_get_alg_null
                              ((uchar **)key,(uchar *)local_190,(mbedtls_asn1_buf *)&cipher_ctx);
            if (iVar1 != 0) goto LAB_00170505;
            if (cipher_ctx._8_8_ != 8) {
              return -0x2e80;
            }
            if (*(long *)cipher_ctx.add_padding != 0x7020df78648862a) {
              return -0x2e80;
            }
            if ((mbedtls_md_info_t *)key._0_8_ != local_190) {
              return -0x2f66;
            }
          }
        }
      }
      else {
LAB_00170505:
        if (iVar1 + -0x2f00 != 0) {
          return iVar1 + -0x2f00;
        }
      }
      local_190 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
      if (local_190 != (mbedtls_md_info_t *)0x0) {
        iVar1 = mbedtls_asn1_get_alg(&p,end,&enc_scheme_oid,&enc_scheme_params);
        if (iVar1 != 0) goto LAB_00170440;
        iVar1 = mbedtls_oid_get_cipher_alg(&enc_scheme_oid,&cipher_alg);
        if (iVar1 == 0) {
          cipher_info = mbedtls_cipher_info_from_type(cipher_alg);
          if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
            return -0x2e80;
          }
          keylen = cipher_info->key_bitlen >> 3;
          if (enc_scheme_params.tag != 4) {
            return -0x2f00;
          }
          if (enc_scheme_params.len != cipher_info->iv_size) {
            return -0x2f00;
          }
          mbedtls_md_init(&md_ctx);
          mbedtls_cipher_init(&cipher_ctx);
          memcpy(iv,enc_scheme_params.p,enc_scheme_params.len);
          iVar1 = mbedtls_md_setup(&md_ctx,local_190,1);
          if ((((iVar1 == 0) &&
               (iVar1 = mbedtls_pkcs5_pbkdf2_hmac
                                  (&md_ctx,pwd,pwdlen,salt.p,salt.len,iterations,keylen,key),
               iVar1 == 0)) && (iVar1 = mbedtls_cipher_setup(&cipher_ctx,cipher_info), iVar1 == 0))
             && (iVar1 = mbedtls_cipher_setkey(&cipher_ctx,key,keylen << 3,mode), iVar1 == 0)) {
            iVar2 = mbedtls_cipher_crypt
                              (&cipher_ctx,iv,enc_scheme_params.len,data,datalen,output,&olen);
            iVar1 = -0x2e00;
            if (iVar2 == 0) {
              iVar1 = 0;
            }
          }
          mbedtls_md_free(&md_ctx);
          mbedtls_cipher_free(&cipher_ctx);
          return iVar1;
        }
      }
    }
    iVar1 = -0x2e80;
  }
  else {
LAB_00170440:
    iVar1 = iVar1 + -0x2f00;
  }
  return iVar1;
}

Assistant:

int mbedtls_pkcs5_pbes2( const mbedtls_asn1_buf *pbe_params, int mode,
                 const unsigned char *pwd,  size_t pwdlen,
                 const unsigned char *data, size_t datalen,
                 unsigned char *output )
{
    int ret, iterations = 0, keylen = 0;
    unsigned char *p, *end;
    mbedtls_asn1_buf kdf_alg_oid, enc_scheme_oid, kdf_alg_params, enc_scheme_params;
    mbedtls_asn1_buf salt;
    mbedtls_md_type_t md_type = MBEDTLS_MD_SHA1;
    unsigned char key[32], iv[32];
    size_t olen = 0;
    const mbedtls_md_info_t *md_info;
    const mbedtls_cipher_info_t *cipher_info;
    mbedtls_md_context_t md_ctx;
    mbedtls_cipher_type_t cipher_alg;
    mbedtls_cipher_context_t cipher_ctx;

    p = pbe_params->p;
    end = p + pbe_params->len;

    /*
     *  PBES2-params ::= SEQUENCE {
     *    keyDerivationFunc AlgorithmIdentifier {{PBES2-KDFs}},
     *    encryptionScheme AlgorithmIdentifier {{PBES2-Encs}}
     *  }
     */
    if( pbe_params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &kdf_alg_oid, &kdf_alg_params ) ) != 0 )
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );

    // Only PBKDF2 supported at the moment
    //
    if( MBEDTLS_OID_CMP( MBEDTLS_OID_PKCS5_PBKDF2, &kdf_alg_oid ) != 0 )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    if( ( ret = pkcs5_parse_pbkdf2_params( &kdf_alg_params,
                                           &salt, &iterations, &keylen,
                                           &md_type ) ) != 0 )
    {
        return( ret );
    }

    md_info = mbedtls_md_info_from_type( md_type );
    if( md_info == NULL )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    if( ( ret = mbedtls_asn1_get_alg( &p, end, &enc_scheme_oid,
                              &enc_scheme_params ) ) != 0 )
    {
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT + ret );
    }

    if( mbedtls_oid_get_cipher_alg( &enc_scheme_oid, &cipher_alg ) != 0 )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    cipher_info = mbedtls_cipher_info_from_type( cipher_alg );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE );

    /*
     * The value of keylen from pkcs5_parse_pbkdf2_params() is ignored
     * since it is optional and we don't know if it was set or not
     */
    keylen = cipher_info->key_bitlen / 8;

    if( enc_scheme_params.tag != MBEDTLS_ASN1_OCTET_STRING ||
        enc_scheme_params.len != cipher_info->iv_size )
    {
        return( MBEDTLS_ERR_PKCS5_INVALID_FORMAT );
    }

    mbedtls_md_init( &md_ctx );
    mbedtls_cipher_init( &cipher_ctx );

    memcpy( iv, enc_scheme_params.p, enc_scheme_params.len );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_pkcs5_pbkdf2_hmac( &md_ctx, pwd, pwdlen, salt.p, salt.len,
                                   iterations, keylen, key ) ) != 0 )
    {
        goto exit;
    }

    if( ( ret = mbedtls_cipher_setup( &cipher_ctx, cipher_info ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_setkey( &cipher_ctx, key, 8 * keylen, (mbedtls_operation_t) mode ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_cipher_crypt( &cipher_ctx, iv, enc_scheme_params.len,
                              data, datalen, output, &olen ) ) != 0 )
        ret = MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH;

exit:
    mbedtls_md_free( &md_ctx );
    mbedtls_cipher_free( &cipher_ctx );

    return( ret );
}